

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

uint32_t libyuv::SumPixels_16(int iboxwidth,uint32_t *src_ptr)

{
  int x;
  uint32_t sum;
  uint32_t *src_ptr_local;
  int iboxwidth_local;
  
  sum = 0;
  for (x = 0; x < iboxwidth; x = x + 1) {
    sum = src_ptr[x] + sum;
  }
  return sum;
}

Assistant:

static __inline uint32_t SumPixels_16(int iboxwidth, const uint32_t* src_ptr) {
  uint32_t sum = 0u;
  int x;
  assert(iboxwidth > 0);
  for (x = 0; x < iboxwidth; ++x) {
    sum += src_ptr[x];
  }
  return sum;
}